

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O2

void __thiscall
duckdb::ListColumnData::Skip(ListColumnData *this,ColumnScanState *state,idx_t count)

{
  reference pvVar1;
  idx_t count_00;
  pointer pCVar2;
  ColumnData *this_00;
  ulong uVar3;
  long lVar4;
  undefined1 local_f0 [24];
  UnifiedVectorFormat offsets;
  Vector offset_vector;
  
  pvVar1 = vector<duckdb::ColumnScanState,_true>::get<true>(&state->child_states,0);
  ColumnScanState::Next(pvVar1,count);
  LogicalType::LogicalType((LogicalType *)local_f0,UBIGINT);
  Vector::Vector(&offset_vector,(LogicalType *)local_f0,count);
  this_00 = (ColumnData *)local_f0;
  LogicalType::~LogicalType((LogicalType *)this_00);
  count_00 = ColumnData::ScanVector(this_00,state,&offset_vector,count,SCAN_FLAT_VECTOR,0);
  UnifiedVectorFormat::UnifiedVectorFormat(&offsets);
  Vector::ToUnifiedFormat(&offset_vector,count_00,&offsets);
  if ((offsets.sel)->sel_vector == (sel_t *)0x0) {
    uVar3 = count_00 - 1;
  }
  else {
    uVar3 = (ulong)(offsets.sel)->sel_vector[count_00 - 1];
  }
  lVar4 = *(idx_t *)(offsets.data + uVar3 * 8) - state->last_offset;
  if (lVar4 != 0) {
    state->last_offset = *(idx_t *)(offsets.data + uVar3 * 8);
    pCVar2 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
             operator->(&this->child_column);
    pvVar1 = vector<duckdb::ColumnScanState,_true>::get<true>(&state->child_states,1);
    (*pCVar2->_vptr_ColumnData[0x10])(pCVar2,pvVar1,lVar4);
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&offsets);
  Vector::~Vector(&offset_vector);
  return;
}

Assistant:

void ListColumnData::Skip(ColumnScanState &state, idx_t count) {
	// skip inside the validity segment
	validity.Skip(state.child_states[0], count);

	// we need to read the list entries/offsets to figure out how much to skip
	// note that we only need to read the first and last entry
	// however, let's just read all "count" entries for now
	Vector offset_vector(LogicalType::UBIGINT, count);
	idx_t scan_count = ScanVector(state, offset_vector, count, ScanVectorType::SCAN_FLAT_VECTOR);
	D_ASSERT(scan_count > 0);

	UnifiedVectorFormat offsets;
	offset_vector.ToUnifiedFormat(scan_count, offsets);
	auto data = UnifiedVectorFormat::GetData<uint64_t>(offsets);
	auto last_entry = data[offsets.sel->get_index(scan_count - 1)];
	idx_t child_scan_count = last_entry - state.last_offset;
	if (child_scan_count == 0) {
		return;
	}
	state.last_offset = last_entry;

	// skip the child state forward by the child_scan_count
	child_column->Skip(state.child_states[1], child_scan_count);
}